

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  float *pfVar1;
  nk_panel_type *pnVar2;
  undefined8 uVar3;
  int in_ECX;
  long in_RSI;
  float *in_RDI;
  float w_3;
  float w_2;
  float ratio;
  float w_1;
  float w;
  float panel_space;
  float item_spacing;
  float item_width;
  float item_offset;
  nk_vec2 spacing;
  nk_style *style;
  nk_panel *layout;
  float local_70;
  float local_6c;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float fStack_34;
  
  local_3c = 0.0;
  local_40 = 0.0;
  local_44 = 0.0;
  if (in_RSI == 0) {
    return;
  }
  if (*(long *)(in_RSI + 0x40d8) != 0) {
    if (*(long *)(*(long *)(in_RSI + 0x40d8) + 0xa8) != 0) {
      pnVar2 = *(nk_panel_type **)(*(long *)(in_RSI + 0x40d8) + 0xa8);
      uVar3 = *(undefined8 *)(in_RSI + 0x1e8c);
      local_6c = nk_layout_row_calculate_usable_space
                           ((nk_style *)(in_RSI + 0x168),*pnVar2,(float)pnVar2[4],pnVar2[0x20]);
      local_38 = (float)uVar3;
      switch(pnVar2[0x1c]) {
      case NK_PANEL_NONE:
        if (local_6c <= 1.0) {
          local_6c = 1.0;
        }
        local_3c = (float)(int)pnVar2[0x1d] * (local_6c / (float)(int)pnVar2[0x20]);
        local_40 = local_6c / (float)(int)pnVar2[0x20] + (local_3c - (float)(int)local_3c);
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        break;
      case NK_PANEL_WINDOW:
        local_3c = (float)pnVar2[0x26];
        local_40 = (float)pnVar2[0x24] * local_6c + (local_3c - (float)(int)local_3c);
        local_44 = 0.0;
        if (in_ECX != 0) {
          pnVar2[0x26] = (nk_panel_type)
                         ((float)pnVar2[0x24] * local_6c + local_38 + (float)pnVar2[0x26]);
          pnVar2[0x27] = (nk_panel_type)((float)pnVar2[0x24] + (float)pnVar2[0x27]);
          pnVar2[0x1d] = NK_PANEL_NONE;
        }
        break;
      case NK_PANEL_GROUP:
        *in_RDI = (float)pnVar2[4] * (float)pnVar2[0x28] + (float)pnVar2[10];
        *in_RDI = *in_RDI - (float)**(uint **)(pnVar2 + 6);
        in_RDI[1] = (float)pnVar2[0x1e] * (float)pnVar2[0x29] + (float)pnVar2[0xb];
        in_RDI[1] = in_RDI[1] - (float)**(uint **)(pnVar2 + 8);
        in_RDI[2] = (float)pnVar2[4] * (float)pnVar2[0x2a] + (*in_RDI - (float)(int)*in_RDI);
        in_RDI[3] = (float)pnVar2[0x1e] * (float)pnVar2[0x2b] + (in_RDI[1] - (float)(int)in_RDI[1]);
        return;
      case NK_PANEL_GROUP|NK_PANEL_WINDOW:
        pfVar1 = (float *)(*(undefined8 *)(pnVar2 + 0x22) + (long)(int)pnVar2[0x1d] * 4);
        if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
          local_70 = *(float *)(*(undefined8 *)(pnVar2 + 0x22) + (long)(int)pnVar2[0x1d] * 4);
        }
        else {
          local_70 = (float)pnVar2[0x24];
        }
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        local_3c = (float)pnVar2[0x26];
        local_40 = local_70 * local_6c + (local_3c - (float)(int)local_3c);
        if (in_ECX != 0) {
          pnVar2[0x26] = (nk_panel_type)(local_70 * local_6c + (float)pnVar2[0x26]);
          pnVar2[0x27] = (nk_panel_type)(local_70 + (float)pnVar2[0x27]);
        }
        break;
      case NK_PANEL_POPUP:
        local_40 = (float)pnVar2[0x24];
        local_3c = (float)(int)pnVar2[0x1d] * local_40;
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        break;
      case NK_PANEL_POPUP|NK_PANEL_WINDOW:
        local_40 = (float)pnVar2[0x24];
        local_3c = (float)pnVar2[0x26];
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        if (in_ECX != 0) {
          pnVar2[0x26] = (nk_panel_type)(local_40 + (float)pnVar2[0x26]);
        }
        break;
      case NK_PANEL_POPUP|NK_PANEL_GROUP:
        *in_RDI = (float)pnVar2[10] + (float)pnVar2[0x28];
        in_RDI[2] = (float)pnVar2[0x2a];
        if (((float)pnVar2[0xc] <= *in_RDI + in_RDI[2] && *in_RDI + in_RDI[2] != (float)pnVar2[0xc])
           && (in_ECX != 0)) {
          pnVar2[0xc] = (nk_panel_type)(*in_RDI + in_RDI[2]);
        }
        *in_RDI = *in_RDI - (float)**(uint **)(pnVar2 + 6);
        in_RDI[1] = (float)pnVar2[0xb] + (float)pnVar2[0x29];
        in_RDI[1] = in_RDI[1] - (float)**(uint **)(pnVar2 + 8);
        in_RDI[3] = (float)pnVar2[0x2b];
        return;
      case NK_PANEL_POPUP|NK_PANEL_GROUP|NK_PANEL_WINDOW:
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        local_40 = *(float *)(*(undefined8 *)(pnVar2 + 0x22) + (long)(int)pnVar2[0x1d] * 4);
        local_3c = (float)pnVar2[0x26];
        if (in_ECX != 0) {
          pnVar2[0x26] = (nk_panel_type)(local_40 + (float)pnVar2[0x26]);
        }
        break;
      case 8:
        local_3c = (float)pnVar2[0x26];
        local_40 = (float)pnVar2[(long)(int)pnVar2[0x1d] + 0x2d] + (local_3c - (float)(int)local_3c)
        ;
        local_44 = (float)(int)pnVar2[0x1d] * local_38;
        if (in_ECX != 0) {
          pnVar2[0x26] = (nk_panel_type)
                         ((float)pnVar2[(long)(int)pnVar2[0x1d] + 0x2d] + (float)pnVar2[0x26]);
        }
      }
      in_RDI[2] = local_40;
      fStack_34 = (float)((ulong)uVar3 >> 0x20);
      in_RDI[3] = (float)pnVar2[0x1e] - fStack_34;
      in_RDI[1] = (float)pnVar2[0xb] - (float)**(uint **)(pnVar2 + 8);
      *in_RDI = (float)pnVar2[10] + local_3c + local_44;
      if (((float)pnVar2[0xc] <= *in_RDI + in_RDI[2] && *in_RDI + in_RDI[2] != (float)pnVar2[0xc])
         && (in_ECX != 0)) {
        pnVar2[0xc] = (nk_panel_type)(*in_RDI + in_RDI[2]);
      }
      *in_RDI = *in_RDI - (float)**(uint **)(pnVar2 + 6);
      return;
    }
    return;
  }
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
struct nk_window *win, int modify)
{
struct nk_panel *layout;
const struct nk_style *style;

struct nk_vec2 spacing;

float item_offset = 0;
float item_width = 0;
float item_spacing = 0;
float panel_space = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
NK_ASSERT(bounds);

spacing = style->window.spacing;
panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
layout->bounds.w, layout->row.columns);

#define NK_FRAC(x) (x - (int)x) /* will be used to remove fookin gaps */
/* calculate the width of one item inside the current layout space */
switch (layout->row.type) {
case NK_LAYOUT_DYNAMIC_FIXED: {
/* scaling fixed size widgets item width */
float w = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
item_offset = (float)layout->row.index * w;
item_width = w + NK_FRAC(item_offset);
item_spacing = (float)layout->row.index * spacing.x;
} break;
case NK_LAYOUT_DYNAMIC_ROW: {
/* scaling single ratio widget width */
float w = layout->row.item_width * panel_space;
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);
item_spacing = 0;

if (modify) {
layout->row.item_offset += w + spacing.x;
layout->row.filled += layout->row.item_width;
layout->row.index = 0;
}
} break;
case NK_LAYOUT_DYNAMIC_FREE: {
/* panel width depended free widget placing */
bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
bounds->x -= (float)*layout->offset_x;
bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
bounds->y -= (float)*layout->offset_y;
bounds->w = layout->bounds.w  * layout->row.item.w + NK_FRAC(bounds->x);
bounds->h = layout->row.height * layout->row.item.h + NK_FRAC(bounds->y);
return;
}
case NK_LAYOUT_DYNAMIC: {
/* scaling arrays of panel width ratios for every widget */
float ratio, w;
NK_ASSERT(layout->row.ratio);
ratio = (layout->row.ratio[layout->row.index] < 0) ?
layout->row.item_width : layout->row.ratio[layout->row.index];

w = (ratio * panel_space);
item_spacing = (float)layout->row.index * spacing.x;
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);

if (modify) {
layout->row.item_offset += w;
layout->row.filled += ratio;
}
} break;
case NK_LAYOUT_STATIC_FIXED: {
/* non-scaling fixed widgets item width */
item_width = layout->row.item_width;
item_offset = (float)layout->row.index * item_width;
item_spacing = (float)layout->row.index * spacing.x;
} break;
case NK_LAYOUT_STATIC_ROW: {
/* scaling single ratio widget width */
item_width = layout->row.item_width;
item_offset = layout->row.item_offset;
item_spacing = (float)layout->row.index * spacing.x;
if (modify) layout->row.item_offset += item_width;
} break;
case NK_LAYOUT_STATIC_FREE: {
/* free widget placing */
bounds->x = layout->at_x + layout->row.item.x;
bounds->w = layout->row.item.w;
if (((bounds->x + bounds->w) > layout->max_x) && modify)
layout->max_x = (bounds->x + bounds->w);
bounds->x -= (float)*layout->offset_x;
bounds->y = layout->at_y + layout->row.item.y;
bounds->y -= (float)*layout->offset_y;
bounds->h = layout->row.item.h;
return;
}
case NK_LAYOUT_STATIC: {
/* non-scaling array of panel pixel width for every widget */
item_spacing = (float)layout->row.index * spacing.x;
item_width = layout->row.ratio[layout->row.index];
item_offset = layout->row.item_offset;
if (modify) layout->row.item_offset += item_width;
} break;
case NK_LAYOUT_TEMPLATE: {
/* stretchy row layout with combined dynamic/static widget width*/
float w;
NK_ASSERT(layout->row.index < layout->row.columns);
NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
w = layout->row.templates[layout->row.index];
item_offset = layout->row.item_offset;
item_width = w + NK_FRAC(item_offset);
item_spacing = (float)layout->row.index * spacing.x;
if (modify) layout->row.item_offset += w;
} break;
#undef NK_FRAC
default: NK_ASSERT(0); break;
};

/* set the bounds of the newly allocated widget */
bounds->w = item_width;
bounds->h = layout->row.height - spacing.y;
bounds->y = layout->at_y - (float)*layout->offset_y;
bounds->x = layout->at_x + item_offset + item_spacing;
if (((bounds->x + bounds->w) > layout->max_x) && modify)
layout->max_x = bounds->x + bounds->w;
bounds->x -= (float)*layout->offset_x;
}